

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Simplex_tree.h
# Opt level: O2

pair<boost::container::vec_iterator<std::pair<short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<MyOptions>_>_>_*,_false>,_bool>
 __thiscall
Gudhi::Simplex_tree<MyOptions>::insert_node_<false,true,false,double_const&>
          (Simplex_tree<MyOptions> *this,Siblings *sib,Vertex_handle v,double *filtration_value)

{
  __buckets_ptr pp_Var1;
  __node_base_ptr p_Var2;
  undefined6 in_register_00000012;
  pair<boost::container::vec_iterator<std::pair<short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<MyOptions>_>_>_*,_false>,_bool>
  pVar4;
  Vertex_handle v_local;
  Siblings *sib_local;
  ulong uVar3;
  
  sib_local = (Siblings *)CONCAT62(in_register_00000012,v);
  v_local = (Vertex_handle)filtration_value;
  pVar4 = boost::container::
          flat_map<short,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<MyOptions>>,std::less<short>,void>
          ::
          try_emplace<Gudhi::Simplex_tree_siblings<Gudhi::Simplex_tree<MyOptions>,boost::container::flat_map<short,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<MyOptions>>,std::less<short>,void>>*&,double_const&>
                    ((flat_map<short,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<MyOptions>>,std::less<short>,void>
                      *)this,(key_type *)&sib_local->members_,
                     (Simplex_tree_siblings<Gudhi::Simplex_tree<MyOptions>,_boost::container::flat_map<short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<MyOptions>_>,_std::less<short>,_void>_>
                      **)&v_local,(double *)&sib_local);
  uVar3 = pVar4._8_8_;
  pp_Var1 = (this->nodes_label_to_list_)._M_h._M_buckets;
  if (*(short *)&pp_Var1[1][1]._M_nxt != *(short *)pp_Var1) {
    p_Var2 = (__node_base_ptr)operator_new(0x28);
    uVar3 = (ulong)(ushort)v_local;
    p_Var2->_M_nxt = (_Hash_node_base *)sib_local;
    *(Vertex_handle *)&p_Var2[1]._M_nxt = v_local;
    p_Var2[2]._M_nxt = (_Hash_node_base *)0x0;
    p_Var2[3]._M_nxt = (_Hash_node_base *)0x0;
    p_Var2[4]._M_nxt = (_Hash_node_base *)0x0;
    pp_Var1[1] = p_Var2;
  }
  pVar4._8_8_ = uVar3;
  pVar4.first.m_ptr =
       (pair<short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<MyOptions>_>_> *)
       this;
  return pVar4;
}

Assistant:

std::pair<Dictionary_it, bool> insert_node_(Siblings *sib, Vertex_handle v, Filt&& filtration_value) {
    std::pair<Dictionary_it, bool> ins = sib->members_.try_emplace(v, sib, std::forward<Filt>(filtration_value));

    if constexpr (update_children){
      if (!(has_children(ins.first))) {
        ins.first->second.assign_children(new Siblings(sib, v));
      }
    }

    if (ins.second){
      // Only required when insertion is successful
      update_simplex_tree_after_node_insertion(ins.first);
      return ins;
    }

    if constexpr (Options::store_filtration && update_fil){
      if (unify_lifetimes(ins.first->second.filtration(), filtration_value)) return ins;
    }

    if constexpr (set_to_null){
      ins.first = Dictionary_it();
    }

    return ins;
  }